

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O3

int_type __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::underflow
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this)

{
  long lVar1;
  long lVar2;
  byte *pbVar3;
  uint uVar4;
  
  uVar4 = 0xffffffff;
  if (this->Stream != (uv_stream_t *)0x0) {
    pbVar3 = *(byte **)&this->field_0x10;
    if (*(byte **)&this->field_0x18 <= pbVar3) {
      StreamReadStartStop(this);
      while( true ) {
        lVar1 = *(long *)&this->field_0x10;
        lVar2 = *(long *)&this->field_0x18;
        if (lVar2 != lVar1) break;
        lVar1 = (**(code **)(*(long *)this + 0x38))(this);
        if (lVar1 != 0) {
          lVar1 = *(long *)&this->field_0x10;
          lVar2 = *(long *)&this->field_0x18;
          break;
        }
        uv_run(this->Stream->loop,UV_RUN_ONCE);
      }
      lVar2 = lVar2 - lVar1;
      if (lVar2 == 0) {
        lVar2 = (**(code **)(*(long *)this + 0x38))(this);
      }
      if (lVar2 == -1) {
        return -1;
      }
      pbVar3 = *(byte **)&this->field_0x10;
    }
    uVar4 = (uint)*pbVar3;
  }
  return uVar4;
}

Assistant:

typename cmBasicUVStreambuf<CharT, Traits>::int_type
cmBasicUVStreambuf<CharT, Traits>::underflow()
{
  if (!this->is_open()) {
    return Traits::eof();
  }

  if (this->gptr() < this->egptr()) {
    return Traits::to_int_type(*this->gptr());
  }

  this->StreamReadStartStop();
  while (this->in_avail() == 0) {
    uv_run(this->Stream->loop, UV_RUN_ONCE);
  }
  if (this->in_avail() == -1) {
    return Traits::eof();
  }
  return Traits::to_int_type(*this->gptr());
}